

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

void VP8YuvToBgra32_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  uint8_t *puVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  unkbyte10 Var25;
  unkbyte9 Var26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined6 uVar36;
  undefined4 uVar37;
  undefined2 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ulong uVar45;
  ushort uVar46;
  undefined2 uVar47;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined4 uVar48;
  undefined6 uVar49;
  undefined8 uVar50;
  undefined1 auVar51 [12];
  undefined1 auVar52 [14];
  undefined1 auVar53 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  
  auVar44 = _DAT_001b8300;
  auVar43 = _DAT_001b82f0;
  auVar42 = _DAT_001b82d0;
  auVar41 = _DAT_001b82c0;
  auVar40 = _DAT_001b82a0;
  auVar39 = _DAT_001b8290;
  uVar45 = 0xfffffffffffffff8;
  do {
    uVar50 = *(undefined8 *)(y + uVar45 + 8);
    auVar27[10] = 0;
    auVar27._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar27[0xb] = (char)((ulong)uVar50 >> 0x28);
    auVar30[9] = (char)((ulong)uVar50 >> 0x20);
    auVar30._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar30._10_2_ = auVar27._10_2_;
    auVar33._9_3_ = auVar30._9_3_;
    auVar33._0_9_ = (unkuint9)0;
    auVar72._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar33._8_4_,(char)((ulong)uVar50 >> 0x18))) << 0x38,6);
    auVar72[0] = (char)((ulong)uVar50 >> 0x10);
    auVar72._11_5_ = 0;
    auVar65._1_12_ = SUB1612(auVar72 << 0x28,4);
    auVar65[0] = (char)((ulong)uVar50 >> 8);
    auVar65._13_3_ = 0;
    auVar61._1_14_ = SUB1614(auVar65 << 0x18,2);
    auVar61[0] = (char)uVar50;
    auVar61[0xf] = 0;
    auVar65 = pmulhuw(auVar61 << 8,auVar39);
    uVar50 = *(undefined8 *)(u + uVar45 + 8);
    auVar28[10] = 0;
    auVar28._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar28[0xb] = (char)((ulong)uVar50 >> 0x28);
    auVar31[9] = (char)((ulong)uVar50 >> 0x20);
    auVar31._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar31._10_2_ = auVar28._10_2_;
    auVar34._9_3_ = auVar31._9_3_;
    auVar34._0_9_ = (unkuint9)0;
    auVar20._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar34._8_4_,(char)((ulong)uVar50 >> 0x18))) << 0x38,6);
    auVar20[0] = (char)((ulong)uVar50 >> 0x10);
    auVar20._11_5_ = 0;
    auVar19._1_12_ = SUB1612(auVar20 << 0x28,4);
    auVar19[0] = (char)((ulong)uVar50 >> 8);
    auVar19._13_3_ = 0;
    auVar63._1_14_ = SUB1614(auVar19 << 0x18,2);
    auVar63[0] = (char)uVar50;
    auVar63[0xf] = 0;
    uVar50 = *(undefined8 *)(v + uVar45 + 8);
    auVar29[10] = 0;
    auVar29._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar29[0xb] = (char)((ulong)uVar50 >> 0x28);
    auVar32[9] = (char)((ulong)uVar50 >> 0x20);
    auVar32._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar32._10_2_ = auVar29._10_2_;
    auVar35._9_3_ = auVar32._9_3_;
    auVar35._0_9_ = (unkuint9)0;
    auVar22._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar35._8_4_,(char)((ulong)uVar50 >> 0x18))) << 0x38,6);
    auVar22[0] = (char)((ulong)uVar50 >> 0x10);
    auVar22._11_5_ = 0;
    auVar21._1_12_ = SUB1612(auVar22 << 0x28,4);
    auVar21[0] = (char)((ulong)uVar50 >> 8);
    auVar21._13_3_ = 0;
    auVar71._1_14_ = SUB1614(auVar21 << 0x18,2);
    auVar71[0] = (char)uVar50;
    auVar71[0xf] = 0;
    auVar61 = pmulhuw(auVar71 << 8,auVar40);
    auVar62._0_2_ = auVar61._0_2_ + auVar65._0_2_ + -0x379a;
    auVar62._2_2_ = auVar61._2_2_ + auVar65._2_2_ + -0x379a;
    auVar62._4_2_ = auVar61._4_2_ + auVar65._4_2_ + -0x379a;
    auVar62._6_2_ = auVar61._6_2_ + auVar65._6_2_ + -0x379a;
    auVar62._8_2_ = auVar61._8_2_ + auVar65._8_2_ + -0x379a;
    auVar62._10_2_ = auVar61._10_2_ + auVar65._10_2_ + -0x379a;
    auVar62._12_2_ = auVar61._12_2_ + auVar65._12_2_ + -0x379a;
    auVar62._14_2_ = auVar61._14_2_ + auVar65._14_2_ + -0x379a;
    auVar72 = pmulhuw(auVar63 << 8,auVar41);
    auVar71 = pmulhuw(auVar71 << 8,auVar42);
    auVar61 = pmulhuw(auVar63 << 8,auVar43);
    auVar61 = paddusw(auVar61,auVar65);
    auVar66._0_2_ = (auVar65._0_2_ - (auVar71._0_2_ + auVar72._0_2_)) + 0x2204;
    auVar66._2_2_ = (auVar65._2_2_ - (auVar71._2_2_ + auVar72._2_2_)) + 0x2204;
    auVar66._4_2_ = (auVar65._4_2_ - (auVar71._4_2_ + auVar72._4_2_)) + 0x2204;
    auVar66._6_2_ = (auVar65._6_2_ - (auVar71._6_2_ + auVar72._6_2_)) + 0x2204;
    auVar66._8_2_ = (auVar65._8_2_ - (auVar71._8_2_ + auVar72._8_2_)) + 0x2204;
    auVar66._10_2_ = (auVar65._10_2_ - (auVar71._10_2_ + auVar72._10_2_)) + 0x2204;
    auVar66._12_2_ = (auVar65._12_2_ - (auVar71._12_2_ + auVar72._12_2_)) + 0x2204;
    auVar66._14_2_ = (auVar65._14_2_ - (auVar71._14_2_ + auVar72._14_2_)) + 0x2204;
    auVar61 = psubusw(auVar61,auVar44);
    auVar63 = psraw(auVar62,6);
    auVar71 = psraw(auVar66,6);
    sVar3 = auVar71._0_2_;
    sVar4 = auVar71._2_2_;
    sVar5 = auVar71._4_2_;
    sVar6 = auVar71._6_2_;
    sVar7 = auVar71._8_2_;
    sVar8 = auVar71._10_2_;
    sVar9 = auVar71._12_2_;
    sVar10 = auVar71._14_2_;
    uVar46 = auVar61._0_2_ >> 6;
    uVar54 = auVar61._2_2_ >> 6;
    uVar55 = auVar61._4_2_ >> 6;
    uVar56 = auVar61._6_2_ >> 6;
    uVar57 = auVar61._8_2_ >> 6;
    uVar58 = auVar61._10_2_ >> 6;
    uVar59 = auVar61._12_2_ >> 6;
    uVar60 = auVar61._14_2_ >> 6;
    cVar2 = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
    sVar11 = auVar63._0_2_;
    sVar12 = auVar63._2_2_;
    sVar13 = auVar63._4_2_;
    sVar14 = auVar63._6_2_;
    sVar15 = auVar63._8_2_;
    sVar16 = auVar63._10_2_;
    sVar17 = auVar63._12_2_;
    sVar18 = auVar63._14_2_;
    uVar38 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar71[0xe] - (0xff < sVar10),cVar2);
    uVar37 = CONCAT31(CONCAT21(uVar38,(0 < sVar9) * (sVar9 < 0x100) * auVar71[0xc] - (0xff < sVar9))
                      ,(uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59));
    uVar36 = CONCAT51(CONCAT41(uVar37,(0 < sVar8) * (sVar8 < 0x100) * auVar71[10] - (0xff < sVar8)),
                      (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58));
    Var26 = CONCAT72(CONCAT61(uVar36,(0 < sVar7) * (sVar7 < 0x100) * auVar71[8] - (0xff < sVar7)),
                     CONCAT11((uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57),
                              cVar2));
    Var25 = CONCAT91(CONCAT81((long)((unkuint9)Var26 >> 8),
                              (0 < sVar6) * (sVar6 < 0x100) * auVar71[6] - (0xff < sVar6)),
                     (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56));
    auVar24._2_10_ = Var25;
    auVar24[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar71[4] - (0xff < sVar5);
    auVar24[0] = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
    auVar23._2_12_ = auVar24;
    auVar23[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar71[2] - (0xff < sVar4);
    auVar23[0] = (uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 - (0xff < uVar54);
    auVar64._0_2_ =
         CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar71[0] - (0xff < sVar3),
                  (uVar46 != 0) * (uVar46 < 0x100) * (char)uVar46 - (0xff < uVar46));
    auVar64._2_14_ = auVar23;
    uVar47 = CONCAT11(0xff,(0 < sVar11) * (sVar11 < 0x100) * auVar63[0] - (0xff < sVar11));
    uVar48 = CONCAT13(0xff,CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar63[2] - (0xff < sVar12),
                                    uVar47));
    uVar49 = CONCAT15(0xff,CONCAT14((0 < sVar13) * (sVar13 < 0x100) * auVar63[4] - (0xff < sVar13),
                                    uVar48));
    uVar50 = CONCAT17(0xff,CONCAT16((0 < sVar14) * (sVar14 < 0x100) * auVar63[6] - (0xff < sVar14),
                                    uVar49));
    auVar51._0_10_ =
         CONCAT19(0xff,CONCAT18((0 < sVar15) * (sVar15 < 0x100) * auVar63[8] - (0xff < sVar15),
                                uVar50));
    auVar51[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar63[10] - (0xff < sVar16);
    auVar51[0xb] = 0xff;
    auVar52[0xc] = (0 < sVar17) * (sVar17 < 0x100) * auVar63[0xc] - (0xff < sVar17);
    auVar52._0_12_ = auVar51;
    auVar52[0xd] = 0xff;
    auVar53[0xe] = (0 < sVar18) * (sVar18 < 0x100) * auVar63[0xe] - (0xff < sVar18);
    auVar53._0_14_ = auVar52;
    auVar53[0xf] = 0xff;
    auVar70._0_12_ = auVar64._0_12_;
    auVar70._12_2_ = (short)Var25;
    auVar70._14_2_ = (short)((ulong)uVar50 >> 0x30);
    auVar69._12_4_ = auVar70._12_4_;
    auVar69._0_10_ = auVar64._0_10_;
    auVar69._10_2_ = (short)((uint6)uVar49 >> 0x20);
    auVar68._10_6_ = auVar69._10_6_;
    auVar68._0_8_ = auVar64._0_8_;
    auVar68._8_2_ = auVar24._0_2_;
    auVar67._8_8_ = auVar68._8_8_;
    auVar67._6_2_ = (short)((uint)uVar48 >> 0x10);
    auVar67._4_2_ = auVar23._0_2_;
    auVar67._2_2_ = uVar47;
    auVar67._0_2_ = auVar64._0_2_;
    *(undefined1 (*) [16])(dst + uVar45 * 4 + 0x20) = auVar67;
    puVar1 = dst + uVar45 * 4 + 0x30;
    *(short *)puVar1 = (short)((unkuint9)Var26 >> 8);
    *(short *)(puVar1 + 2) = (short)((unkuint10)auVar51._0_10_ >> 0x40);
    *(short *)(puVar1 + 4) = (short)uVar36;
    *(short *)(puVar1 + 6) = auVar51._10_2_;
    *(short *)(puVar1 + 8) = (short)uVar37;
    *(short *)(puVar1 + 10) = auVar52._12_2_;
    *(undefined2 *)(puVar1 + 0xc) = uVar38;
    *(short *)(puVar1 + 0xe) = auVar53._14_2_;
    uVar45 = uVar45 + 8;
  } while (uVar45 < 0x18);
  return;
}

Assistant:

void VP8YuvToBgra32_SSE2(const uint8_t* WEBP_RESTRICT y,
                         const uint8_t* WEBP_RESTRICT u,
                         const uint8_t* WEBP_RESTRICT v,
                         uint8_t* WEBP_RESTRICT dst) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n < 32; n += 8, dst += 32) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore4_SSE2(&B, &G, &R, &kAlpha, dst);
  }
}